

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
qpdf::Array::getAsVector
          (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__return_storage_ptr__,
          Array *this)

{
  bool bVar1;
  int iVar2;
  QPDF_Array *this_00;
  pointer pSVar3;
  reference ppVar4;
  pair<const_int,_QPDFObjectHandle> *item;
  iterator __end2;
  iterator __begin2;
  map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
  *__range2;
  QPDF_Array *a;
  Array *this_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *v;
  
  this_00 = array(this);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this_00);
  if (bVar1) {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(__return_storage_ptr__)
    ;
    iVar2 = size(this);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::reserve
              (__return_storage_ptr__,(long)iVar2);
    pSVar3 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
             operator->(&this_00->sp);
    __end2 = std::
             map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
             ::begin(&pSVar3->elements);
    item = (pair<const_int,_QPDFObjectHandle> *)
           std::
           map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
           ::end(&pSVar3->elements);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&item), bVar1) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator*(&__end2);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::resize
                (__return_storage_ptr__,(long)ppVar4->first,&null_oh);
      std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
      emplace_back<QPDFObjectHandle_const&>
                ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)__return_storage_ptr__
                 ,&ppVar4->second);
      std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator++(&__end2);
    }
    iVar2 = size(this);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::resize
              (__return_storage_ptr__,(long)iVar2,&null_oh);
  }
  else {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              (__return_storage_ptr__,&this_00->elements);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFObjectHandle>
Array::getAsVector() const
{
    auto a = array();
    if (a->sp) {
        std::vector<QPDFObjectHandle> v;
        v.reserve(size_t(size()));
        for (auto const& item: a->sp->elements) {
            v.resize(size_t(item.first), null_oh);
            v.emplace_back(item.second);
        }
        v.resize(size_t(size()), null_oh);
        return v;
    } else {
        return a->elements;
    }
}